

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void refreshSingleLine(linenoiseState *l)

{
  int __fd;
  char *s;
  size_t sVar1;
  size_t sVar2;
  undefined1 local_90 [8];
  abuf ab;
  size_t pos;
  size_t len;
  char *buf;
  int fd;
  size_t plen;
  char seq [64];
  linenoiseState *l_local;
  
  sVar1 = strlen(l->prompt);
  __fd = l->ofd;
  len = (size_t)l->buf;
  pos = l->len;
  for (ab._8_8_ = l->pos; l->cols <= sVar1 + ab._8_8_; ab._8_8_ = ab._8_8_ + -1) {
    len = len + 1;
    pos = pos - 1;
  }
  for (; l->cols < sVar1 + pos; pos = pos - 1) {
  }
  abInit((abuf *)local_90);
  snprintf((char *)&plen,0x40,"\r");
  sVar2 = strlen((char *)&plen);
  abAppend((abuf *)local_90,(char *)&plen,(int)sVar2);
  s = l->prompt;
  sVar2 = strlen(l->prompt);
  abAppend((abuf *)local_90,s,(int)sVar2);
  abAppend((abuf *)local_90,(char *)len,(int)pos);
  snprintf((char *)&plen,0x40,"\x1b[0K");
  sVar2 = strlen((char *)&plen);
  abAppend((abuf *)local_90,(char *)&plen,(int)sVar2);
  snprintf((char *)&plen,0x40,"\r\x1b[%dC",(ulong)(uint)(ab.len + (int)sVar1));
  sVar1 = strlen((char *)&plen);
  abAppend((abuf *)local_90,(char *)&plen,(int)sVar1);
  write(__fd,(void *)local_90,(long)(int)ab.b);
  abFree((abuf *)local_90);
  return;
}

Assistant:

static void refreshSingleLine(struct linenoiseState *l) {
    char seq[64];
    size_t plen = strlen(l->prompt);
    int fd = l->ofd;
    char *buf = l->buf;
    size_t len = l->len;
    size_t pos = l->pos;
    struct abuf ab;

    while((plen+pos) >= l->cols) {
        buf++;
        len--;
        pos--;
    }
    while (plen+len > l->cols) {
        len--;
    }

    abInit(&ab);
    /* Cursor to left edge */
    snprintf(seq,64,"\r");
    abAppend(&ab,seq,strlen(seq));
    /* Write the prompt and the current buffer content */
    abAppend(&ab,l->prompt,strlen(l->prompt));
    abAppend(&ab,buf,len);
    /* Erase to right */
    snprintf(seq,64,"\x1b[0K");
    abAppend(&ab,seq,strlen(seq));
    /* Move cursor to original position. */
    snprintf(seq,64,"\r\x1b[%dC", (int)(pos+plen));
    abAppend(&ab,seq,strlen(seq));
    if (write(fd,ab.b,ab.len) == -1) {} /* Can't recover from write error. */
    abFree(&ab);
}